

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

float nite::getGeneralScale(void)

{
  undefined8 in_RAX;
  undefined4 local_18;
  undefined4 local_14;
  Vec2 ns;
  
  if ((generalScale == -1.0) && (!NAN(generalScale))) {
    getSize();
    local_18 = (float)in_RAX;
    local_14 = (float)((ulong)in_RAX >> 0x20);
    generalScale = ((local_18 + local_14) * 0.5) / 1000.0;
  }
  return generalScale;
}

Assistant:

float nite::getGeneralScale(){
	if(generalScale == -1.0f){
	  auto ns = nite::getSize();
	  float cs = (ns.x + ns.y) * 0.5f;
	  float bs = (1280.0f + 720.0f) * 0.5f;
	  generalScale = cs / bs;
	}
	return generalScale;
}